

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

void Sbd_StoComputeCutsTest(Gia_Man_t *pGia)

{
  long lVar1;
  int iVar2;
  Sbd_Sto_t *p;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  
  p = Sbd_StoAlloc(pGia,(Vec_Int_t *)0x0,4,8,100,1,1);
  pGVar5 = p->pGia;
  for (iVar6 = 0; iVar6 < pGVar5->nObjs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManObj(pGVar5,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Sbd_StoRefObj(p,iVar6,-1);
  }
  Sbd_StoComputeCutsConst0(p,0);
  for (iVar6 = 0; iVar6 < pGVar5->vCis->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(pGVar5->vCis,iVar6);
    pGVar3 = Gia_ManObj(pGVar5,iVar2);
    iVar2 = Gia_ObjId(pGVar5,pGVar3);
    if (iVar2 == 0) break;
    Sbd_StoComputeCutsCi(p,iVar2,0,0);
  }
  for (iVar6 = 0; iVar6 < pGVar5->nObjs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManObj(pGVar5,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      Sbd_StoComputeCutsNode(p,iVar6);
    }
    pGVar5 = p->pGia;
  }
  if (p->fVerbose != 0) {
    printf("Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n",
           (ulong)(uint)p->nLutSize,(ulong)(uint)p->nCutSize,(ulong)(uint)p->nCutNum);
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    pGVar5 = p->pGia;
    printf("Cut/Node = %.2f  ",
           p->CutCount[3] / (double)(~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + pGVar5->nObjs));
    putchar(10);
    printf("Spec = %4d  ",(ulong)(uint)p->nCutsSpec);
    printf("Over = %4d  ",(ulong)(uint)p->nCutsOver);
    iVar6 = 0x807dff;
    printf("Lev = %4d  ",(ulong)(uint)p->DelayMin);
    aVar4 = Abc_Clock();
    lVar1 = p->clkStart;
    Abc_Print(iVar6,"%s =","Time");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar4 - lVar1) / 1000000.0);
  }
  Sbd_StoFree(p);
  return;
}

Assistant:

void Sbd_StoComputeCutsTest( Gia_Man_t * pGia )
{
    Sbd_Sto_t * p = Sbd_StoAlloc( pGia, NULL, 4, 8, 100, 1, 1 );
    Gia_Obj_t * pObj;   
    int i, iObj;
    // prepare references
    Gia_ManForEachObj( p->pGia, pObj, iObj )
        Sbd_StoRefObj( p, iObj, -1 );
    // compute cuts
    Sbd_StoComputeCutsConst0( p, 0 );
    Gia_ManForEachCiId( p->pGia, iObj, i )
        Sbd_StoComputeCutsCi( p, iObj, 0, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
        Sbd_StoComputeCutsNode( p, iObj );
    if ( p->fVerbose )
    {
        printf( "Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n", p->nLutSize, p->nCutSize, p->nCutNum );
        printf( "CutPair = %.0f  ",         p->CutCount[0] );
        printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
        printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
        printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
        printf( "Cut/Node = %.2f  ",        p->CutCount[3] / Gia_ManAndNum(p->pGia) );
        printf( "\n" );
        printf( "Spec = %4d  ",             p->nCutsSpec );
        printf( "Over = %4d  ",             p->nCutsOver );
        printf( "Lev = %4d  ",              p->DelayMin );
        Abc_PrintTime( 0, "Time", Abc_Clock() - p->clkStart );
    }
    Sbd_StoFree( p );
}